

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestUploadCommand::Clone(cmCTestUploadCommand *this)

{
  cmCTestHandlerCommand *this_00;
  cmMakefile **ppcVar1;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xd8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestUploadCommand_00786e28;
  ppcVar1 = &this_00[1].super_cmCTestCommand.super_cmCommand.Makefile;
  *(undefined4 *)&this_00[1].super_cmCTestCommand.super_cmCommand.Makefile = 0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_dataplus._M_p = (pointer)0x0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_string_length = (size_type)ppcVar1;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2._M_allocated_capacity =
       (size_type)ppcVar1;
  *(undefined8 *)((long)&this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2 + 8) = 0;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestUploadCommand* ni = new cmCTestUploadCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }